

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_DCtx_loadDictionary_advanced
                 (ZSTD_DCtx *dctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_DDict *pZVar1;
  ZSTD_dictLoadMethod_e in_ECX;
  ulong in_RDX;
  ZSTD_DDict *in_RSI;
  long in_RDI;
  ZSTD_dictContentType_e in_R8D;
  ZSTD_customMem in_stack_00000000;
  size_t local_8;
  
  if (*(int *)(in_RDI + 0x7168) == 0) {
    ZSTD_freeDDict(in_RSI);
    if ((in_RSI == (ZSTD_DDict *)0x0) || (in_RDX < 8)) {
      *(undefined8 *)(in_RDI + 0x7158) = 0;
    }
    else {
      pZVar1 = ZSTD_createDDict_advanced(in_RSI,in_RDX,in_ECX,in_R8D,in_stack_00000000);
      *(ZSTD_DDict **)(in_RDI + 0x7158) = pZVar1;
      if (*(long *)(in_RDI + 0x7158) == 0) {
        return 0xffffffffffffffc0;
      }
    }
    *(undefined8 *)(in_RDI + 0x7160) = *(undefined8 *)(in_RDI + 0x7158);
    local_8 = 0;
  }
  else {
    local_8 = 0xffffffffffffffc4;
  }
  return local_8;
}

Assistant:

size_t ZSTD_DCtx_loadDictionary_advanced(ZSTD_DCtx* dctx, const void* dict, size_t dictSize, ZSTD_dictLoadMethod_e dictLoadMethod, ZSTD_dictContentType_e dictContentType)
{
    if (dctx->streamStage != zdss_init) return ERROR(stage_wrong);
    ZSTD_freeDDict(dctx->ddictLocal);
    if (dict && dictSize >= 8) {
        dctx->ddictLocal = ZSTD_createDDict_advanced(dict, dictSize, dictLoadMethod, dictContentType, dctx->customMem);
        if (dctx->ddictLocal == NULL) return ERROR(memory_allocation);
    } else {
        dctx->ddictLocal = NULL;
    }
    dctx->ddict = dctx->ddictLocal;
    return 0;
}